

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::Reflection::UnsafeArenaAddAllocatedMessage
          (Reflection *this,Message *message,FieldDescriptor *field,Message *new_entry)

{
  bool bVar1;
  uint32_t uVar2;
  MapFieldBase *this_00;
  FieldDescriptor *local_38;
  _func_void_FieldDescriptor_ptr *local_30;
  
  if (*(Descriptor **)(field + 0x20) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"UnsafeArenaAddAllocatedMessage",
               "Field does not match message type.");
  }
  if ((~(byte)field[1] & 0x60) != 0) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"UnsafeArenaAddAllocatedMessage",
               "Field is singular; the method requires a repeated field.");
  }
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    local_30 = FieldDescriptor::TypeOnceInit;
    local_38 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),&local_30,&local_38);
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4) != 10) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"UnsafeArenaAddAllocatedMessage",CPPTYPE_MESSAGE);
  }
  if (((byte)field[1] & 8) == 0) {
    bVar1 = anon_unknown_0::IsMapFieldInApi(field);
    uVar2 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    this_00 = (MapFieldBase *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2)
    ;
    if (bVar1) {
      this_00 = (MapFieldBase *)internal::MapFieldBase::MutableRepeatedField(this_00);
    }
    internal::RepeatedPtrFieldBase::
    UnsafeArenaAddAllocated<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
              ((RepeatedPtrFieldBase *)this_00,new_entry);
  }
  else {
    uVar2 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    internal::ExtensionSet::UnsafeArenaAddAllocatedMessage
              ((ExtensionSet *)
               ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),field,
               &new_entry->super_MessageLite);
  }
  return;
}

Assistant:

void Reflection::UnsafeArenaAddAllocatedMessage(Message* message,
                                                const FieldDescriptor* field,
                                                Message* new_entry) const {
  USAGE_CHECK_ALL(UnsafeArenaAddAllocatedMessage, REPEATED, MESSAGE);
  CheckInvalidAccess(schema_, field);

  if (field->is_extension()) {
    MutableExtensionSet(message)->UnsafeArenaAddAllocatedMessage(field,
                                                                 new_entry);
  } else {
    RepeatedPtrFieldBase* repeated = nullptr;
    if (IsMapFieldInApi(field)) {
      repeated =
          MutableRaw<MapFieldBase>(message, field)->MutableRepeatedField();
    } else {
      repeated = MutableRaw<RepeatedPtrFieldBase>(message, field);
    }
    repeated->UnsafeArenaAddAllocated<GenericTypeHandler<Message>>(new_entry);
  }
}